

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# view.cpp
# Opt level: O3

double r_exec::View::MorphChange(double change,double source_thr,double destination_thr)

{
  if (source_thr <= 0.0) {
    change = change + destination_thr;
  }
  else if (0.0 < destination_thr) {
    return (change * destination_thr) / source_thr;
  }
  return change;
}

Assistant:

double View::MorphChange(double change, double source_thr, double destination_thr)   // change is always >0.
{
    if (source_thr > 0) {
        if (destination_thr > 0) {
            return change * destination_thr / source_thr;
        } else {
            return change;
        }
    }

    return destination_thr + change;
}